

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *
cppwinrt::get_bases(vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                    *__return_storage_ptr__,TypeDef *type)

{
  row_base<winmd::reader::TypeDef> rVar1;
  TypeDef local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rVar1 = (row_base<winmd::reader::TypeDef>)get_base_class(type);
  local_20.super_row_base<winmd::reader::TypeDef>.m_table = rVar1.m_table;
  while (local_20.super_row_base<winmd::reader::TypeDef>.m_index = rVar1.m_index,
        rVar1.m_table != (table_base *)0x0) {
    std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::push_back
              (__return_storage_ptr__,&local_20);
    rVar1 = (row_base<winmd::reader::TypeDef>)get_base_class(&local_20);
    local_20.super_row_base<winmd::reader::TypeDef>.m_table = rVar1.m_table;
  }
  return __return_storage_ptr__;
}

Assistant:

static auto get_bases(TypeDef const& type)
    {
        std::vector<TypeDef> bases;

        for (auto base = get_base_class(type); base; base = get_base_class(base))
        {
            bases.push_back(base);
        }

        return bases;
    }